

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O2

LongNameHandler *
icu_63::number::impl::LongNameHandler::forMeasureUnit
          (Locale *loc,MeasureUnit *unitRef,MeasureUnit *perUnit,UNumberUnitWidth *width,
          PluralRules *rules,MicroPropsGenerator *parent,UErrorCode *status)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  long lVar3;
  char *unit_00;
  bool isResolved;
  MeasureUnit unit;
  MeasureUnit resolved;
  
  MeasureUnit::MeasureUnit(&unit,unitRef);
  __s1 = MeasureUnit::getType(perUnit);
  unit_00 = "none";
  iVar2 = strcmp(__s1,"none");
  if (iVar2 != 0) {
    isResolved = false;
    MeasureUnit::resolveUnitPerUnit(&resolved,&unit,perUnit,&isResolved);
    bVar1 = isResolved;
    if (isResolved == true) {
      unit_00 = (char *)&resolved;
      MeasureUnit::operator=(&unit,(MeasureUnit *)unit_00);
    }
    else {
      unit_00 = (char *)&unit;
      perUnit = (MeasureUnit *)
                forCompoundUnit(loc,(MeasureUnit *)unit_00,perUnit,width,rules,parent,status);
    }
    MeasureUnit::~MeasureUnit(&resolved);
    if (bVar1 == false) goto LAB_00250f93;
  }
  perUnit = (MeasureUnit *)UMemory::operator_new((UMemory *)0x2c0,(size_t)unit_00);
  if ((LongNameHandler *)perUnit == (LongNameHandler *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    perUnit = (MeasureUnit *)0x0;
  }
  else {
    LongNameHandler((LongNameHandler *)perUnit,rules,parent);
    lVar3 = 0;
    do {
      *(undefined ***)(resolved.fCurrency + lVar3 + -0x10) = &PTR__UnicodeString_003a7268;
      (resolved.fCurrency + lVar3 + -8)[0] = '\x02';
      (resolved.fCurrency + lVar3 + -8)[1] = '\0';
      lVar3 = lVar3 + 0x40;
    } while (lVar3 != 0x200);
    anon_unknown.dwarf_1665be::getMeasureData(loc,&unit,width,(UnicodeString *)&resolved,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      simpleFormatsToModifiers
                ((LongNameHandler *)perUnit,(UnicodeString *)&resolved,UNUM_FIELD_COUNT,status);
    }
    lVar3 = 0x1c0;
    do {
      UnicodeString::~UnicodeString((UnicodeString *)(resolved.fCurrency + lVar3 + -0x10));
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != -0x40);
  }
LAB_00250f93:
  MeasureUnit::~MeasureUnit(&unit);
  return (LongNameHandler *)perUnit;
}

Assistant:

LongNameHandler*
LongNameHandler::forMeasureUnit(const Locale &loc, const MeasureUnit &unitRef, const MeasureUnit &perUnit,
                                const UNumberUnitWidth &width, const PluralRules *rules,
                                const MicroPropsGenerator *parent, UErrorCode &status) {
    MeasureUnit unit = unitRef;
    if (uprv_strcmp(perUnit.getType(), "none") != 0) {
        // Compound unit: first try to simplify (e.g., meters per second is its own unit).
        bool isResolved = false;
        MeasureUnit resolved = MeasureUnit::resolveUnitPerUnit(unit, perUnit, &isResolved);
        if (isResolved) {
            unit = resolved;
        } else {
            // No simplified form is available.
            return forCompoundUnit(loc, unit, perUnit, width, rules, parent, status);
        }
    }

    auto* result = new LongNameHandler(rules, parent);
    if (result == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    UnicodeString simpleFormats[ARRAY_LENGTH];
    getMeasureData(loc, unit, width, simpleFormats, status);
    if (U_FAILURE(status)) { return result; }
    // TODO: What field to use for units?
    result->simpleFormatsToModifiers(simpleFormats, UNUM_FIELD_COUNT, status);
    return result;
}